

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O0

void __thiscall
QPDFObjectHandle::filterPageContents(QPDFObjectHandle *this,TokenFilter *filter,Pipeline *next)

{
  char *identifier;
  undefined1 local_b0 [8];
  Pl_QPDFTokenizer token_pipeline;
  QPDFObjGen local_68;
  string local_60;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> description;
  Pipeline *next_local;
  TokenFilter *filter_local;
  QPDFObjectHandle *this_local;
  
  description.field_2._8_8_ = next;
  local_68 = getObjGen(this);
  QPDFObjGen::unparse_abi_cxx11_(&local_60,&local_68,' ');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 "token filter for page object ",&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  identifier = (char *)std::__cxx11::string::c_str();
  Pl_QPDFTokenizer::Pl_QPDFTokenizer
            ((Pl_QPDFTokenizer *)local_b0,identifier,filter,(Pipeline *)description.field_2._8_8_);
  pipePageContents(this,(Pipeline *)local_b0);
  Pl_QPDFTokenizer::~Pl_QPDFTokenizer((Pl_QPDFTokenizer *)local_b0);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void
QPDFObjectHandle::filterPageContents(TokenFilter* filter, Pipeline* next)
{
    auto description = "token filter for page object " + getObjGen().unparse(' ');
    Pl_QPDFTokenizer token_pipeline(description.c_str(), filter, next);
    this->pipePageContents(&token_pipeline);
}